

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O3

ResultStats *
deqp::gls::anon_unknown_1::calculateStats
          (ResultStats *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *values)

{
  unsigned_long uVar1;
  pointer puVar2;
  ResultStats *pRVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  double dVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedValues;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  __return_storage_ptr__->variance = 0.0;
  __return_storage_ptr__->min = 0;
  __return_storage_ptr__->median = 0.0;
  __return_storage_ptr__->mean = 0.0;
  __return_storage_ptr__->max = 0;
  __return_storage_ptr__->min = 0xffffffffffffffff;
  puVar2 = (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  lVar5 = (long)uVar8 >> 3;
  uVar4 = (uint)lVar5;
  iVar16 = (int)((long)uVar8 >> 0x23);
  if ((int)uVar4 < 1) {
    auVar12._8_4_ = iVar16;
    auVar12._0_8_ = lVar5;
    auVar12._12_4_ = 0x45300000;
    dVar9 = (auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0);
    dVar14 = 0.0;
    __return_storage_ptr__->mean = 0.0 / dVar9;
  }
  else {
    uVar6 = 0;
    lVar7 = 0;
    do {
      lVar7 = lVar7 + puVar2[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar6);
    auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = 0x45300000;
    auVar15._8_4_ = iVar16;
    auVar15._0_8_ = lVar5;
    auVar15._12_4_ = 0x45300000;
    dVar9 = (auVar15._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0);
    dVar13 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) / dVar9;
    __return_storage_ptr__->mean = dVar13;
    if ((int)uVar4 < 1) {
      dVar14 = 0.0;
    }
    else {
      dVar14 = 0.0;
      uVar6 = 0;
      do {
        uVar1 = puVar2[uVar6];
        auVar17._8_4_ = (int)(uVar1 >> 0x20);
        auVar17._0_8_ = uVar1;
        auVar17._12_4_ = 0x45300000;
        dVar18 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) - dVar13;
        dVar14 = dVar14 + dVar18 * dVar18;
        uVar6 = uVar6 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar6);
    }
  }
  __return_storage_ptr__->variance = dVar14 / dVar9;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_40,values);
  puVar2 = local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start >> 3;
    lVar5 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar2,local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  auVar11._0_8_ =
       (double)CONCAT44(0x43300000,
                        (int)local_40.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[(int)(uVar8 >> 4)]);
  auVar11._8_4_ =
       (int)(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[(int)(uVar8 >> 4)] >> 0x20);
  auVar11._12_4_ = 0x45300000;
  __return_storage_ptr__->median =
       (auVar11._8_8_ - 1.9342813113834067e+25) + (auVar11._0_8_ - 4503599627370496.0);
  operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  pRVar3 = (ResultStats *)
           (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(values->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pRVar3) >> 3);
  if (0 < (int)uVar4) {
    dVar9 = -NAN;
    uVar8 = 0;
    dVar14 = 0.0;
    do {
      dVar13 = (&pRVar3->median)[uVar8];
      if ((ulong)dVar13 < (ulong)dVar9) {
        dVar9 = dVar13;
      }
      if ((ulong)dVar13 < (ulong)dVar14) {
        dVar13 = dVar14;
      }
      uVar8 = uVar8 + 1;
      dVar14 = dVar13;
    } while ((uVar4 & 0x7fffffff) != uVar8);
    __return_storage_ptr__->min = (deUint64)dVar9;
    __return_storage_ptr__->max = (deUint64)dVar13;
  }
  return pRVar3;
}

Assistant:

ResultStats calculateStats (const vector<deUint64>& values)
{
	ResultStats result = { 0.0, 0.0, 0.0, 0xFFFFFFFFFFFFFFFFu, 0 };

	deUint64 sum = 0;

	for (int i = 0; i < (int)values.size(); i++)
		sum += values[i];

	result.mean = ((double)sum) / (double)values.size();

	for (int i = 0; i < (int)values.size(); i++)
	{
		const double val = (double)values[i];
		result.variance += (val - result.mean) * (val - result.mean);
	}

	result.variance /= (double)values.size();

	{
		const int n = (int)(values.size()/2);

		vector<deUint64> sortedValues = values;

		std::sort(sortedValues.begin(), sortedValues.end());

		result.median = (double)sortedValues[n];
	}

	for (int i = 0; i < (int)values.size(); i++)
	{
		result.min = std::min(result.min, values[i]);
		result.max = std::max(result.max, values[i]);
	}

	return result;
}